

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

string * __thiscall
MADPComponentFactoredStates::SoftPrintState_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentFactoredStates *this,Index sI)

{
  string *psVar1;
  pointer puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec;
  stringstream ss;
  stringstream ss_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_528;
  long *local_510;
  long local_508;
  long local_500 [2];
  string *local_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  stringstream local_4c8 [16];
  ostream local_4b8 [112];
  ios_base local_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_4c8);
  IndexTools::JointToIndividualIndicesStepSize
            (&local_528,sI,this->_m_stepSize,this->_m_nrStateFactors);
  std::__cxx11::stringstream::stringstream(local_340);
  puVar2 = local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_4f0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"< ",2);
  if (puVar2 != local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (puVar2 != local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_510,local_508);
      if (local_510 != local_500) {
        operator_delete(local_510,local_500[0] + 1);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)local_4e8,local_4e0);
  psVar1 = local_4f0;
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(local_448);
  return psVar1;
}

Assistant:

string MADPComponentFactoredStates::SoftPrintState(Index sI) const
{
    stringstream ss;
    vector<Index> s_vec = StateIndexToFactorValueIndices(sI);
    ss << SoftPrintVector(s_vec);
    return(ss.str());
    
}